

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::api::anon_unknown_1::ComputePipeline::create
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  DeviceInterface *vk;
  VkDevice device;
  Handle<(vk::HandleType)14> *pHVar1;
  Handle<(vk::HandleType)16> *pHVar2;
  Handle<(vk::HandleType)15> *pHVar3;
  undefined1 local_88 [8];
  VkComputePipelineCreateInfo pipelineInfo;
  Parameters *param_2_local;
  Resources *res_local;
  Environment *env_local;
  
  local_88._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInfo._4_4_ = 0;
  pipelineInfo.pNext._0_4_ = 0;
  pipelineInfo.flags = 0x12;
  pipelineInfo.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInfo.stage._4_4_ = 0;
  pipelineInfo.stage.pNext._0_4_ = 0;
  pipelineInfo.stage.pNext._4_4_ = 0x20;
  pipelineInfo._88_8_ = param_3;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&(res->shaderModule).object.super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  pipelineInfo.stage._16_8_ = pHVar1->m_internal;
  pipelineInfo.stage.module.m_internal = (long)"pre_main" + 4;
  pipelineInfo.stage.pName = (char *)0x0;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(res->layout).object.super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pHVar2->m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&pipelineInfo.layout,0);
  pipelineInfo.basePipelineHandle.m_internal._0_4_ = 0;
  vk = env->vkd;
  device = env->device;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(res->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  ::vk::createComputePipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)pHVar3->m_internal,
             (VkComputePipelineCreateInfo *)local_88,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipeline> create (const Environment& env, const Resources& res, const Parameters&)
	{
		const VkComputePipelineCreateInfo	pipelineInfo	=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,
			DE_NULL,
			(VkPipelineCreateFlags)0,
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				(VkPipelineShaderStageCreateFlags)0,
				VK_SHADER_STAGE_COMPUTE_BIT,
				*res.shaderModule.object,
				"main",
				DE_NULL					// pSpecializationInfo
			},
			*res.layout.object,
			(VkPipeline)0,				// basePipelineHandle
			0u,							// basePipelineIndex
		};

		return createComputePipeline(env.vkd, env.device, *res.pipelineCache.object, &pipelineInfo, env.allocationCallbacks);
	}